

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O1

bool BicTest3<Blob<128>,unsigned_int>(pfHash hash,int reps,bool verbose)

{
  int *piVar1;
  int b;
  void *__s;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint32_t bit;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int keybit;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined8 in_XMM7_Qb;
  uint h2;
  uint h1;
  Blob<128> key;
  uint local_98;
  uint local_94;
  uint local_80;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  Rand local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_58.x = 0x88e23b73;
  local_58.y = 0x11310f6c;
  local_58.z = 0x18847f4;
  local_58.w = 0x1142a2ba;
  local_48 = 0;
  uStack_40 = 0;
  __s = operator_new(0x200000);
  lVar5 = 0;
  memset(__s,0,0x200000);
  lVar11 = (long)__s + 0x10;
  do {
    bit = (uint32_t)lVar5;
    if ((bit * -0x55555555 >> 2 | bit * -0x40000000) < 0x15555556) {
      putchar(0x2e);
    }
    if (0 < reps) {
      iVar14 = 0;
      do {
        Rand::rand_p(&local_58,&local_48,0x10);
        (*hash)(&local_48,0x10,0,&local_7c);
        flipbit(&local_48,0x10,bit);
        (*hash)(&local_48,0x10,0,&local_80);
        lVar3 = -0x1f;
        lVar8 = 0;
        lVar4 = lVar11;
        do {
          uVar7 = (uint)lVar8;
          lVar8 = lVar8 + 1;
          lVar9 = lVar3;
          lVar10 = lVar4;
          do {
            piVar1 = (int *)(lVar10 + (ulong)(((local_80 ^ local_7c) >> (uVar7 & 0x1f) & 1) +
                                             ((local_80 ^ local_7c) >> ((uint)lVar9 & 0x1f) & 1) * 2
                                             ) * 4);
            *piVar1 = *piVar1 + 1;
            lVar10 = lVar10 + 0x10;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
          lVar4 = lVar4 + 0x210;
          lVar3 = lVar3 + 1;
        } while (lVar8 != 0x1f);
        iVar14 = iVar14 + 1;
      } while (iVar14 != reps);
    }
    lVar5 = lVar5 + 1;
    lVar11 = lVar11 + 0x4000;
  } while (lVar5 != 0x80);
  putchar(10);
  lVar11 = (long)__s + 0x10;
  auVar15 = ZEXT864(0) << 0x40;
  uVar2 = 1;
  auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar13 = 0;
  local_98 = 0;
  local_94 = 0;
  uVar6 = 0;
  do {
    local_78 = uVar6 + 1;
    local_70 = uVar2;
    local_68 = lVar11;
    do {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar6 & 0xffffffff,uVar2 & 0xffffffff);
        auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar15 = ZEXT864(auVar15._0_8_);
      }
      uVar12 = 0;
      local_60 = lVar11;
      do {
        auVar18 = ZEXT864(0) << 0x40;
        lVar5 = 0;
        do {
          auVar16._0_8_ = (double)*(int *)(lVar11 + lVar5 * 4) / (double)(reps / 2);
          auVar16._8_8_ = in_XMM7_Qb;
          auVar16 = vfmadd213sd_fma(auVar16,auVar19._0_16_,auVar20._0_16_);
          auVar16 = vandpd_avx(auVar16,auVar21._0_16_);
          auVar16 = vmaxsd_avx(auVar16,auVar18._0_16_);
          auVar18 = ZEXT1664(auVar16);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        dVar17 = auVar16._0_8_;
        if (auVar15._0_8_ < dVar17) {
          uVar13 = uVar12 & 0xffffffff;
          auVar15 = ZEXT1664(auVar16);
          local_98 = (uint)uVar6;
          local_94 = (uint)uVar2;
        }
        if (verbose) {
          iVar14 = 0x2e;
          if ((0.01 <= dVar17) && (iVar14 = 0x6f, 0.05 <= dVar17)) {
            iVar14 = (uint)(0.33 <= dVar17) * 9 + 0x4f;
          }
          putchar(iVar14);
          auVar15 = ZEXT864(auVar15._0_8_);
          auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        }
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x4000;
      } while (uVar12 != 0x80);
      if (verbose) {
        putchar(10);
        auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar15 = ZEXT864(auVar15._0_8_);
      }
      lVar5 = local_68;
      uVar2 = uVar2 + 1;
      lVar11 = local_60 + 0x10;
    } while (uVar2 != 0x20);
    if (verbose) {
      iVar14 = 0x8c;
      do {
        putchar(0x2d);
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      putchar(10);
      auVar15 = ZEXT864(auVar15._0_8_);
      auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    uVar2 = local_70 + 1;
    lVar11 = lVar5 + 0x210;
    uVar6 = local_78;
  } while (local_78 != 0x1f);
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar13,(ulong)local_98,(ulong)local_94);
  operator_delete(__s);
  return auVar15._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}